

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O3

htmlparser_ctx * ctemplate_htmlparser::htmlparser_new(void)

{
  htmlparser_ctx *ctx;
  statemachine_definition *def;
  statemachine_ctx *psVar1;
  jsparser_ctx *pjVar2;
  entityfilter_ctx *peVar3;
  
  ctx = (htmlparser_ctx *)calloc(1,0x328);
  if ((ctx != (htmlparser_ctx *)0x0) &&
     (def = statemachine_definition_new(0x21), def != (statemachine_definition *)0x0)) {
    statemachine_definition_populate
              (def,(int **)htmlparser_state_transitions,(char **)htmlparser_states_internal_names);
    statemachine_enter_state(def,2,enter_tag_name);
    statemachine_exit_state(def,2,exit_tag_name);
    statemachine_enter_state(def,0xd,enter_attr);
    statemachine_exit_state(def,0xd,exit_attr);
    statemachine_enter_state(def,0xc,tag_close);
    statemachine_in_state(def,0x1a,in_state_cdata);
    statemachine_in_state(def,0x15,in_state_cdata);
    statemachine_in_state(def,0x16,in_state_cdata);
    statemachine_in_state(def,0x17,in_state_cdata);
    statemachine_in_state(def,0x18,in_state_cdata);
    statemachine_in_state(def,0x19,in_state_cdata);
    statemachine_in_state(def,0x1b,in_state_cdata);
    statemachine_in_state(def,0x1c,in_state_cdata);
    statemachine_in_state(def,0x1d,in_state_cdata);
    statemachine_enter_state(def,0x1c,enter_state_cdata_may_close);
    statemachine_exit_state(def,0x1c,exit_state_cdata_may_close);
    statemachine_enter_state(def,0xf,enter_value);
    statemachine_enter_state(def,0x10,enter_value_content);
    statemachine_enter_state(def,0x12,enter_value_content);
    statemachine_enter_state(def,0x14,enter_value_content);
    statemachine_exit_state(def,0x10,exit_value_content);
    statemachine_exit_state(def,0x12,exit_value_content);
    statemachine_exit_state(def,0x14,exit_value_content);
    statemachine_in_state(def,0x10,in_state_value);
    statemachine_in_state(def,0x12,in_state_value);
    statemachine_in_state(def,0x14,in_state_value);
    ctx->statemachine_def = def;
    psVar1 = statemachine_new(def,ctx);
    ctx->statemachine = psVar1;
    if (psVar1 != (statemachine_ctx *)0x0) {
      pjVar2 = jsparser_new();
      ctx->jsparser = pjVar2;
      if (pjVar2 != (jsparser_ctx *)0x0) {
        peVar3 = (entityfilter_ctx *)malloc(0x1c);
        if (peVar3 != (entityfilter_ctx *)0x0) {
          peVar3->buffer[0] = '\0';
          peVar3->buffer_pos = 0;
          peVar3->in_entity = 0;
          ctx->entityfilter = peVar3;
          htmlparser_reset(ctx);
          return ctx;
        }
        ctx->entityfilter = (entityfilter_ctx *)0x0;
      }
    }
  }
  return (htmlparser_ctx *)0x0;
}

Assistant:

htmlparser_ctx *htmlparser_new()
{
  htmlparser_ctx *html;

  html = CAST(htmlparser_ctx *, calloc(1, sizeof(htmlparser_ctx)));
  if (html == NULL)
    return NULL;

  html->statemachine_def = create_statemachine_definition();
  if (html->statemachine_def == NULL)
    return NULL;

  html->statemachine = statemachine_new(html->statemachine_def, html);
  if (html->statemachine == NULL)
    return NULL;

  html->jsparser = jsparser_new();
  if (html->jsparser == NULL)
    return NULL;

  html->entityfilter = entityfilter_new();
  if (html->entityfilter == NULL)
    return NULL;

  htmlparser_reset(html);

  return html;
}